

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O2

word_type __thiscall
bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>::get
          (bitview<bv::internal::bitarray_t<4096UL>::array> *this,size_t begin,size_t end)

{
  sbyte sVar1;
  word_type wVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = end - (end != 0) >> 6;
  bVar3 = 0x40 - (-(char)end & 0x3fU);
  sVar1 = (bVar3 < 0x41) * ('@' - bVar3);
  uVar4 = ((this->_container)._M_elems[uVar5] << sVar1) >> sVar1;
  if (begin >> 6 < uVar5) {
    bVar3 = (byte)begin & 0x3f;
    return (this->_container)._M_elems[begin >> 6] >> bVar3 | uVar4 << 0x40 - bVar3;
  }
  wVar2 = 0;
  if (begin < end) {
    wVar2 = uVar4 >> (begin & 0x3f);
  }
  return wVar2;
}

Assistant:

bitview_base::word_type
        bitview<C>::get(size_t begin, size_t end) const
        {
            static constexpr size_t bits = bitsize<word_type>();
            static constexpr size_t mask = ~ size_t(0) / bits * bits;
            
            // everything above has been computed at compile time.
            // Now do some work:
            
            // the index in the container of
            // the lower or higher item needed
            size_t lo_index = (begin          ) / bits;
            size_t hi_index = (end - (end > 0)) / bits;
            
            // we read container[hi_adr] first and possibly delete
            // the highest bits:
            size_t hi_shift = size_t(mask - end) % bits;
            word_type hi_val = _container[hi_index] << hi_shift >> hi_shift;
            
            // if all bits are in the same item,
            // we delete the lower bits and are done:
            size_t lo_shift = begin % bits;
            if ( hi_index <= lo_index )
                return (hi_val >> lo_shift) * (begin < end);
            
            // else we have to read the lower item as well, and combine both
            return ( hi_val << (bits - lo_shift)    |
                     _container[lo_index] >> lo_shift );
            
        }